

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O0

Value * soul::generateWaveform(Value *__return_storage_ptr__,Annotation *annotation)

{
  Annotation *pAVar1;
  bool bVar2;
  bool local_1da;
  bool local_192;
  bool local_162;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Annotation *local_18;
  Annotation *annotation_local;
  
  local_18 = annotation;
  annotation_local = (Annotation *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"sinewave",&local_39);
  bVar2 = Annotation::getBool(annotation,&local_38,false);
  pAVar1 = local_18;
  local_162 = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"sine",&local_71);
    local_73 = 1;
    local_162 = Annotation::getBool(pAVar1,&local_70,false);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pAVar1 = local_18;
  if (local_162 == false) {
    std::allocator<char>::allocator();
    local_c2 = 0;
    local_c3 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"sawtooth",&local_99);
    bVar2 = Annotation::getBool(pAVar1,&local_98,false);
    pAVar1 = local_18;
    local_192 = true;
    if (!bVar2) {
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"saw",&local_c1);
      local_c3 = 1;
      local_192 = Annotation::getBool(pAVar1,&local_c0,false);
    }
    if ((local_c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_c1);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pAVar1 = local_18;
    if (local_192 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"triangle",&local_e9);
      bVar2 = Annotation::getBool(pAVar1,&local_e8,false);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      pAVar1 = local_18;
      if (bVar2) {
        generateWaveform<soul::WaveGenerators::Triangle>(__return_storage_ptr__,local_18,2);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"squarewave",&local_111);
        bVar2 = Annotation::getBool(pAVar1,&local_110,false);
        pAVar1 = local_18;
        local_1da = true;
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,"square",&local_139);
          local_1da = Annotation::getBool(pAVar1,&local_138,false);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator(&local_139);
        }
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        if (local_1da == false) {
          choc::value::Value::Value(__return_storage_ptr__);
        }
        else {
          generateWaveform<soul::WaveGenerators::Square>(__return_storage_ptr__,local_18,2);
        }
      }
    }
    else {
      generateWaveform<soul::WaveGenerators::Saw>(__return_storage_ptr__,local_18,2);
    }
  }
  else {
    generateWaveform<soul::WaveGenerators::Sine>(__return_storage_ptr__,local_18,1);
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (const Annotation& annotation)
{
    if (annotation.getBool ("sinewave") || annotation.getBool ("sine"))
        return generateWaveform<WaveGenerators::Sine> (annotation, 1);

    if (annotation.getBool ("sawtooth") || annotation.getBool ("saw"))
        return generateWaveform<WaveGenerators::Saw> (annotation, 2);

    if (annotation.getBool ("triangle"))
        return generateWaveform<WaveGenerators::Triangle> (annotation, 2);

    if (annotation.getBool ("squarewave") || annotation.getBool ("square"))
        return generateWaveform<WaveGenerators::Square> (annotation, 2);

    return {};
}